

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O3

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::ParseOneof<proto2_unittest::TestAllTypes>::
TestBody(ParseOneof<proto2_unittest::TestAllTypes> *this)

{
  string data;
  TestOneof2 dest;
  TestOneof2 source;
  CodedInputStream input;
  ArrayInputStream raw_input;
  string local_128;
  TestOneof2 local_108;
  TestOneof2 local_c8;
  CodedInputStream local_88;
  ArrayInputStream local_30;
  
  proto2_unittest::TestOneof2::TestOneof2(&local_c8,(Arena *)0x0);
  proto2_unittest::TestOneof2::TestOneof2(&local_108,(Arena *)0x0);
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  TestUtil::SetOneof1<proto2_unittest::TestOneof2>(&local_c8);
  MessageLite::SerializeToString((MessageLite *)&local_c8,&local_128);
  io::ArrayInputStream::ArrayInputStream
            (&local_30,local_128._M_dataplus._M_p,(int)local_128._M_string_length,-1);
  local_88.buffer_ = (uint8_t *)0x0;
  local_88.buffer_end_ = (uint8_t *)0x0;
  local_88._24_7_ = 0;
  local_88.overflow_bytes_._3_1_ = 0;
  local_88.last_tag_ = 0;
  local_88.legitimate_message_end_ = false;
  local_88.aliasing_enabled_ = false;
  local_88.force_eager_parsing_ = false;
  local_88.current_limit_ = 0x7fffffff;
  local_88.buffer_size_after_limit_ = 0;
  local_88.total_bytes_limit_ = 0x7fffffff;
  local_88.recursion_budget_ = io::CodedInputStream::default_recursion_limit_;
  local_88.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
  local_88.extension_pool_ = (DescriptorPool *)0x0;
  local_88.extension_factory_ = (MessageFactory *)0x0;
  local_88.input_ = &local_30.super_ZeroCopyInputStream;
  io::CodedInputStream::Refresh(&local_88);
  WireFormat::ParseAndMergePartial(&local_88,&local_108.super_Message);
  TestUtil::ExpectOneofSet1<proto2_unittest::TestOneof2>(&local_108);
  io::CodedInputStream::~CodedInputStream(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  proto2_unittest::TestOneof2::~TestOneof2(&local_108);
  proto2_unittest::TestOneof2::~TestOneof2(&local_c8);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, ParseOneof) {
  typename TestFixture::TestOneof2 source, dest;
  std::string data;

  // Serialize using the generated code.
  TestUtil::SetOneof1(&source);
  source.SerializeToString(&data);

  // Parse using WireFormat.
  io::ArrayInputStream raw_input(data.data(), data.size());
  io::CodedInputStream input(&raw_input);
  WireFormat::ParseAndMergePartial(&input, &dest);

  // Check.
  TestUtil::ExpectOneofSet1(dest);
}